

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_SpawnBlood(DVector3 *pos1,DAngle *dir,int damage,AActor *originator)

{
  byte *pbVar1;
  double dVar2;
  uint kind;
  int iVar3;
  FState *pFVar4;
  FState *pFVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  SDWORD SVar9;
  undefined4 extraout_var;
  PClassActor *type;
  AActor *this;
  FState *newstate;
  undefined4 extraout_var_00;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  FName local_5c;
  DVector3 local_58;
  DAngle local_38;
  PClass *pPVar10;
  
  pPVar10 = (originator->super_DThinker).super_DObject.Class;
  if (pPVar10 == (PClass *)0x0) {
    iVar6 = (**(originator->super_DThinker).super_DObject._vptr_DObject)(originator);
    pPVar10 = (PClass *)CONCAT44(extraout_var,iVar6);
    (originator->super_DThinker).super_DObject.Class = pPVar10;
  }
  kind = *(uint *)&pPVar10[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                   VisitNext;
  type = AActor::GetBloodType(originator,0);
  local_58.X = pos1->X;
  local_58.Y = pos1->Y;
  dVar2 = pos1->Z;
  uVar7 = FRandom::GenRand32(&pr_spawnblood);
  uVar8 = FRandom::GenRand32(&pr_spawnblood);
  iVar6 = cl_bloodtype.Value;
  local_58.Z = (double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.015625 + dVar2;
  uVar7 = cl_bloodtype.Value;
  if (type != (PClassActor *)0x0) {
    iVar3 = *(int *)((type->super_PClass).Defaults + 0x198);
    this = AActor::StaticSpawn(type,&local_58,NO_REPLACE,false);
    (this->Vel).Z = 2.0;
    (this->Angles).Yaw.Degrees = dir->Degrees;
    if (((this->flags5).Value & 0x800000) != 0) {
      (this->target).field_0.p = originator;
    }
    if ((gameinfo.gametype & GAME_DoomChex) != GAME_Any) {
      uVar7 = FRandom::GenRand32(&pr_spawnblood);
      iVar11 = this->tics - (uVar7 & 3);
      SVar9 = 1;
      if (1 < iVar11) {
        SVar9 = iVar11;
      }
      this->tics = SVar9;
    }
    if ((kind != 0) && (((this->flags2).Value & 0x10000) == 0)) {
      this->Translation = kind >> 0x18 | 0x80000;
    }
    uVar7 = (iVar3 << 4) >> 0x1f & iVar6;
    if ((gameinfo.gametype & GAME_DoomStrifeChex) != GAME_Any) {
      if (gameinfo.gametype == GAME_Strife) {
        if (damage < 0xe) {
          damage = damage + 2;
        }
        else {
          local_5c.Index = 0x10;
          newstate = AActor::FindState(this,&local_5c);
          if (newstate != (FState *)0x0) {
LAB_00553ceb:
            AActor::SetState(this,newstate,false);
            goto LAB_00553cf2;
          }
        }
      }
      uVar8 = 1;
      if (3 < damage - 9U) {
        uVar8 = (uint)(damage < 9) * 2;
      }
      pPVar10 = (this->super_DThinker).super_DObject.Class;
      if (pPVar10 == (PClass *)0x0) {
        iVar6 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        pPVar10 = (PClass *)CONCAT44(extraout_var_00,iVar6);
        (this->super_DThinker).super_DObject.Class = pPVar10;
      }
      if (pPVar10 != AActor::RegistrationInfo.MyClass) {
        pFVar4 = this->SpawnState;
        do {
          if (((damage < 0xd) &&
              (pFVar5 = (FState *)
                        pPVar10[1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                        super_DObject._vptr_DObject, pFVar5 <= pFVar4)) &&
             (pFVar5 = pFVar5 + *(int *)&pPVar10[1].super_PStruct.super_PNamedType.
                                         super_PCompoundType.super_PType.super_DObject.GCNext,
             pFVar4 < pFVar5)) {
            uVar13 = (ulong)uVar8;
            do {
              uVar12 = (uint)uVar13;
              newstate = pFVar4 + uVar13;
              if (newstate < pFVar5) goto LAB_00553ceb;
              uVar13 = 1;
            } while (1 < uVar12);
          }
          pPVar10 = pPVar10->ParentClass;
        } while (pPVar10 != AActor::RegistrationInfo.MyClass);
      }
    }
LAB_00553cf2:
    if (1 < (int)uVar7) {
      pbVar1 = (byte *)((long)&(this->renderflags).Value + 1);
      *pbVar1 = *pbVar1 | 0x80;
      goto LAB_00553d09;
    }
  }
  if ((int)uVar7 < 1) {
    return;
  }
LAB_00553d09:
  local_38 = (DAngle)dir->Degrees;
  P_DrawSplash2(0x28,&local_58,&local_38,2,kind);
  return;
}

Assistant:

void P_SpawnBlood (const DVector3 &pos1, DAngle dir, int damage, AActor *originator)
{
	AActor *th;
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType();
	DVector3 pos = pos1;
	pos.Z += pr_spawnblood.Random2() / 64.;

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		th = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		th->Vel.Z = 2;
		th->Angles.Yaw = dir;
		// [NG] Applying PUFFGETSOWNER to the blood will make it target the owner
		if (th->flags5 & MF5_PUFFGETSOWNER) th->target = originator;
		if (gameinfo.gametype & GAME_DoomChex)
		{
			th->tics -= pr_spawnblood() & 3;

			if (th->tics < 1)
				th->tics = 1;
		}
		// colorize the blood
		if (bloodcolor != 0 && !(th->flags2 & MF2_DONTTRANSLATE))
		{
			th->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}
		
		// Moved out of the blood actor so that replacing blood is easier
		if (gameinfo.gametype & GAME_DoomStrifeChex)
		{
			if (gameinfo.gametype == GAME_Strife)
			{
				if (damage > 13)
				{
					FState *state = th->FindState(NAME_Spray);
					if (state != NULL)
					{
						th->SetState (state);
						goto statedone;
					}
				}
				else damage += 2;
			}
			int advance = 0;
			if (damage <= 12 && damage >= 9)
			{
				advance = 1;
			}
			else if (damage < 9)
			{
				advance = 2;
			}

			PClassActor *cls = th->GetClass();

			while (cls != RUNTIME_CLASS(AActor))
			{
				int checked_advance = advance;
				if (cls->OwnsState(th->SpawnState))
				{
					for (; checked_advance > 0; --checked_advance)
					{
						// [RH] Do not set to a state we do not own.
						if (cls->OwnsState(th->SpawnState + checked_advance))
						{
							th->SetState(th->SpawnState + checked_advance);
							goto statedone;
						}
					}
				}
				// We can safely assume the ParentClass is of type PClassActor
				// since we stop when we see the Actor base class.
				cls = static_cast<PClassActor *>(cls->ParentClass);
			}
		}

	statedone:
		if (!(bloodtype <= 1)) th->renderflags |= RF_INVISIBLE;
	}

	if (bloodtype >= 1)
		P_DrawSplash2 (40, pos, dir, 2, bloodcolor);
}